

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordXYZCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlFragCoordXYZCaseInstance *this)

{
  undefined4 uVar1;
  int i;
  long lVar2;
  TestStatus *pTVar3;
  int y;
  uint z;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  uint uVar7;
  uint uVar8;
  Vec3 scaledFC;
  Vec3 fragCoord;
  Vec4 resultColor;
  UVec2 viewportSize;
  deUint16 indices [6];
  float local_110;
  uint uStack_10c;
  uint local_108;
  float local_100;
  float local_fc;
  ConstPixelBufferAccess local_f8;
  TestStatus *local_d0;
  float local_c4 [3];
  undefined1 local_b8 [16];
  undefined1 local_a8 [20];
  float fStack_94;
  void *local_88;
  undefined4 local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ulong local_48;
  deUint16 local_40 [8];
  
  local_d0 = __return_storage_ptr__;
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  uVar8 = (uint)(local_48 >> 0x20);
  local_b8._8_8_ = 0;
  local_b8._0_8_ = local_48;
  local_a8._16_4_ = (undefined4)(int)local_48;
  fStack_94 = (float)(int)uVar8;
  register0x00001248 = 0;
  auVar5 = divps(_DAT_00ad7f10,register0x00001240);
  local_88 = auVar5._0_8_;
  local_80 = 0x3f800000;
  local_40[0] = 2;
  local_40[1] = 1;
  local_40[2] = 3;
  local_40[3] = 0;
  local_40[4] = 1;
  local_40[5] = 2;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  z = 0;
  ShaderRenderCaseInstance::addUniform
            (&this->super_ShaderRenderCaseInstance,0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0xc,&local_88
            );
  local_f8.m_format.order = 0x3e000000;
  local_f8.m_format.type = 0x3e800000;
  local_f8.m_size.m_data[0] = 0x3f000000;
  local_f8.m_size.m_data[1] = 0x3f800000;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,4,2,local_40,(Vec4 *)&local_f8);
  if (0 < (int)uVar8) {
    uVar1 = local_b8._0_4_;
    local_78 = fStack_94;
    fStack_74 = fStack_94;
    fStack_70 = fStack_94;
    fStack_6c = fStack_94;
    do {
      if (0 < (int)uVar1) {
        local_fc = ((float)(int)(~z + uVar8) + 0.5) / local_78;
        local_100 = (float)(int)z + 0.5;
        y = 0;
        do {
          local_c4[0] = (float)y + 0.5;
          local_c4[1] = local_100;
          local_c4[2] = (((float)y + 0.5) / (float)local_a8._16_4_ + local_fc) * 0.5;
          local_108 = 0;
          _local_110 = 0;
          lVar2 = 0;
          do {
            (&local_110)[lVar2] = local_c4[lVar2] * *(float *)((long)&local_88 + lVar2 * 4);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 3);
          local_b8 = ZEXT416((uint)local_110);
          local_58 = ZEXT416(uStack_10c);
          local_68 = ZEXT416(local_108);
          tcu::TextureLevel::getAccess
                    (&local_f8,&(this->super_ShaderRenderCaseInstance).m_resultImage);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_a8,(int)&local_f8,y,z);
          fVar6 = (float)local_b8._0_4_ - (float)local_a8._0_4_;
          uVar7 = (uint)DAT_00ac4b80;
          fVar4 = (float)((uint)fVar6 ^ uVar7);
          if ((float)((uint)fVar6 ^ uVar7) <= fVar6) {
            fVar4 = fVar6;
          }
          if (1e-05 < fVar4) {
LAB_0058f452:
            local_f8.m_format = (TextureFormat)(local_f8.m_size.m_data + 2);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Image mismatch","")
            ;
            pTVar3 = local_d0;
            local_d0->m_code = QP_TEST_RESULT_FAIL;
            (local_d0->m_description)._M_dataplus._M_p = (pointer)&(local_d0->m_description).field_2
            ;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0->m_description,local_f8.m_format,
                       local_f8.m_size.m_data._0_8_ + (long)local_f8.m_format);
            goto LAB_0058f49c;
          }
          fVar6 = (float)local_58._0_4_ - (float)local_a8._4_4_;
          fVar4 = (float)((uint)fVar6 ^ uVar7);
          if ((float)((uint)fVar6 ^ uVar7) <= fVar6) {
            fVar4 = fVar6;
          }
          if (1e-05 < fVar4) goto LAB_0058f452;
          fVar6 = (float)local_68._0_4_ - (float)local_a8._8_4_;
          fVar4 = (float)((uint)fVar6 ^ uVar7);
          if ((float)((uint)fVar6 ^ uVar7) <= fVar6) {
            fVar4 = fVar6;
          }
          if (1e-05 < fVar4) goto LAB_0058f452;
          y = y + 1;
        } while (y != uVar1);
      }
      z = z + 1;
    } while (z != uVar8);
  }
  local_f8.m_format = (TextureFormat)(local_f8.m_size.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"Result image matches reference","");
  pTVar3 = local_d0;
  local_d0->m_code = QP_TEST_RESULT_PASS;
  (local_d0->m_description)._M_dataplus._M_p = (pointer)&(local_d0->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0->m_description,local_f8.m_format,
             local_f8.m_size.m_data._0_8_ + (long)local_f8.m_format);
LAB_0058f49c:
  if (local_f8.m_format != (TextureFormat)(local_f8.m_size.m_data + 2)) {
    operator_delete((void *)local_f8.m_format,local_f8._16_8_ + 1);
  }
  return pTVar3;
}

Assistant:

TestStatus BuiltinGlFragCoordXYZCaseInstance::iterate (void)
{
	const UVec2		viewportSize	= getViewportSize();
	const int		width			= viewportSize.x();
	const int		height			= viewportSize.y();
	const tcu::Vec3	scale			(1.f / float(width), 1.f / float(height), 1.0f);
	const float		precision		= 0.00001f;
	const deUint16	indices[6]		=
	{
		2, 1, 3,
		0, 1, 2,
	};

	setup();
	addUniform(0, VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, scale);

	render(4, 2, indices);

	// Reference image
	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const float	xf			= (float(x) + .5f) / float(width);
			const float	yf			= (float(height - y - 1) + .5f) / float(height);
			const float	z			= (xf + yf) / 2.0f;
			const Vec3	fragCoord	(float(x) + .5f, float(y) + .5f, z);
			const Vec3	scaledFC	= fragCoord*scale;
			const Vec4	color		(scaledFC.x(), scaledFC.y(), scaledFC.z(), 1.0f);
			const Vec4	resultColor	= getResultImage().getAccess().getPixel(x, y);

			if (de::abs(color.x() - resultColor.x()) > precision ||
				de::abs(color.y() - resultColor.y()) > precision ||
				de::abs(color.z() - resultColor.z()) > precision)
			return TestStatus::fail("Image mismatch");
		}
	}

	return TestStatus::pass("Result image matches reference");
}